

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.cpp
# Opt level: O3

shared_ptr<mocker::ast::NonarrayType> __thiscall
mocker::Parser::nonarrayType(Parser *this,TokIter *iter,TokIter end)

{
  mapped_type *pmVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  shared_ptr<mocker::ast::BuiltinType> sVar3;
  shared_ptr<mocker::ast::Identifier> sVar4;
  shared_ptr<mocker::ast::UserDefinedType> sVar5;
  shared_ptr<mocker::ast::NonarrayType> sVar6;
  Position beg;
  shared_ptr<mocker::ast::Identifier> id;
  undefined1 local_58 [24];
  Token *pTStack_40;
  Token *local_30;
  
  sVar3 = builtinType((Parser *)local_58,iter,end);
  _Var2 = sVar3.super___shared_ptr<mocker::ast::BuiltinType,_(__gnu_cxx::_Lock_policy)2>._M_refcount
          ._M_pi;
  if ((Token *)local_58._0_8_ == (Token *)0x0) {
    if ((Token *)local_58._8_8_ != (Token *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
    }
    sVar4 = identifier((Parser *)local_58,iter,end);
    _Var2 = sVar4.super___shared_ptr<mocker::ast::Identifier,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
    if ((Token *)local_58._0_8_ != (Token *)0x0) {
      local_30 = (Token *)local_58._0_8_;
      pmVar1 = std::__detail::
               _Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<unsigned_long,_std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>,_std::allocator<std::pair<const_unsigned_long,_std::pair<mocker::Position,_mocker::Position>_>_>,_std::__detail::_Select1st,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)iter[2]._M_current,(key_type *)&local_30);
      beg.col = (pmVar1->first).line;
      beg.line = (size_t)iter;
      sVar5 = makeNode<mocker::ast::UserDefinedType,std::shared_ptr<mocker::ast::Identifier>&>
                        ((Parser *)(local_58 + 0x10),beg,*(Position *)&(pmVar1->first).col,
                         (shared_ptr<mocker::ast::Identifier> *)(pmVar1->second).col);
      _Var2 = sVar5.super___shared_ptr<mocker::ast::UserDefinedType,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount._M_pi;
      (this->tokBeg)._M_current = (Token *)local_58._16_8_;
      (this->tokEnd)._M_current = pTStack_40;
    }
    if ((Token *)local_58._8_8_ != (Token *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_58._8_8_);
      _Var2._M_pi = extraout_RDX;
    }
    if ((Token *)local_58._0_8_ == (Token *)0x0) {
      (this->tokBeg)._M_current = (Token *)0x0;
      (this->tokEnd)._M_current = (Token *)0x0;
    }
  }
  else {
    (this->tokBeg)._M_current = (Token *)local_58._0_8_;
    (this->tokEnd)._M_current = (Token *)local_58._8_8_;
  }
  sVar6.super___shared_ptr<mocker::ast::NonarrayType,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
       = _Var2._M_pi;
  sVar6.super___shared_ptr<mocker::ast::NonarrayType,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::ast::NonarrayType>)
         sVar6.super___shared_ptr<mocker::ast::NonarrayType,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<ast::NonarrayType> Parser::nonarrayType(TokIter &iter,
                                                        TokIter end) {
  if (auto res = builtinType(iter, end))
    return res;
  if (auto id = identifier(iter, end))
    return makeNode<ast::UserDefinedType>(pos[id->getID()], id);
  return nullptr;
}